

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

void __thiscall QList<QCss::AttributeSelector>::clear(QList<QCss::AttributeSelector> *this)

{
  long lVar1;
  bool bVar2;
  qsizetype qVar3;
  QGenericArrayOps<QCss::AttributeSelector> *this_00;
  __off_t __length;
  QArrayDataPointer<QCss::AttributeSelector> *in_RDI;
  long in_FS_OFFSET;
  DataPointer detached;
  QArrayDataPointer<QCss::AttributeSelector> *in_stack_ffffffffffffffc8;
  AllocationOption option;
  undefined1 *n;
  undefined1 *alloc;
  QArrayDataPointer<QCss::AttributeSelector> *pQVar4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = in_RDI;
  qVar3 = size((QList<QCss::AttributeSelector> *)in_RDI);
  option = (AllocationOption)((ulong)pQVar4 >> 0x20);
  if (qVar3 != 0) {
    QArrayDataPointer<QCss::AttributeSelector>::operator->(in_RDI);
    bVar2 = QArrayDataPointer<QCss::AttributeSelector>::needsDetach(in_RDI);
    if (bVar2) {
      n = &DAT_aaaaaaaaaaaaaaaa;
      alloc = &DAT_aaaaaaaaaaaaaaaa;
      pQVar4 = (QArrayDataPointer<QCss::AttributeSelector> *)&DAT_aaaaaaaaaaaaaaaa;
      QArrayDataPointer<QCss::AttributeSelector>::allocatedCapacity(in_RDI);
      QArrayDataPointer<QCss::AttributeSelector>::QArrayDataPointer
                (pQVar4,(qsizetype)alloc,(qsizetype)n,option);
      QArrayDataPointer<QCss::AttributeSelector>::swap(in_RDI,in_stack_ffffffffffffffc8);
      QArrayDataPointer<QCss::AttributeSelector>::~QArrayDataPointer(in_RDI);
    }
    else {
      this_00 = (QGenericArrayOps<QCss::AttributeSelector> *)
                QArrayDataPointer<QCss::AttributeSelector>::operator->(in_RDI);
      QtPrivate::QGenericArrayOps<QCss::AttributeSelector>::truncate(this_00,(char *)0x0,__length);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void clear() {
        if (!size())
            return;
        if (d->needsDetach()) {
            // must allocate memory
            DataPointer detached(d.allocatedCapacity());
            d.swap(detached);
        } else {
            d->truncate(0);
        }
    }